

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglResizeTests.cpp
# Opt level: O0

Surface * deqp::egl::readSurface(Surface *__return_storage_ptr__,Functions *gl,IVec2 *size)

{
  int iVar1;
  int iVar2;
  code *pcVar3;
  deUint32 err;
  int *piVar4;
  void *pvVar5;
  PixelBufferAccess local_60;
  undefined1 local_21;
  IVec2 *local_20;
  IVec2 *size_local;
  Functions *gl_local;
  Surface *ret;
  
  local_21 = 0;
  local_20 = size;
  size_local = (IVec2 *)gl;
  gl_local = (Functions *)__return_storage_ptr__;
  piVar4 = tcu::Vector<int,_2>::x(size);
  iVar1 = *piVar4;
  piVar4 = tcu::Vector<int,_2>::y(size);
  tcu::Surface::Surface(__return_storage_ptr__,iVar1,*piVar4);
  pcVar3 = *(code **)size_local[0x244].m_data;
  piVar4 = tcu::Vector<int,_2>::x(size);
  iVar1 = *piVar4;
  piVar4 = tcu::Vector<int,_2>::y(size);
  iVar2 = *piVar4;
  tcu::Surface::getAccess(&local_60,__return_storage_ptr__);
  pvVar5 = tcu::PixelBufferAccess::getDataPtr(&local_60);
  (*pcVar3)(0,0,iVar1,iVar2,0x1908,0x1401,pvVar5);
  err = (**(code **)size_local[0x100].m_data)();
  glu::checkError(err,"glReadPixels() failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglResizeTests.cpp"
                  ,0x136);
  return __return_storage_ptr__;
}

Assistant:

Surface readSurface (const glw::Functions& gl, IVec2 size)
{
	Surface ret (size.x(), size.y());
	gl.readPixels(0, 0, size.x(), size.y(), GL_RGBA, GL_UNSIGNED_BYTE,
				  ret.getAccess().getDataPtr());

	GLU_EXPECT_NO_ERROR(gl.getError(), "glReadPixels() failed");
	return ret;
}